

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

void __thiscall
Typelib::Importer::load(Importer *this,string *path,config_set *config,Registry *registry)

{
  byte bVar1;
  char *pcVar2;
  ImportError *this_00;
  allocator local_261;
  string local_260 [48];
  long local_230;
  ifstream s;
  Registry *registry_local;
  config_set *config_local;
  string *path_local;
  Importer *this_local;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_230,pcVar2,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_230 + *(long *)(local_230 + -0x18)));
  if ((bVar1 & 1) == 0) {
    (*this->_vptr_Importer[2])(this,&local_230,config,registry);
    std::ifstream::~ifstream(&local_230);
    return;
  }
  this_00 = (ImportError *)__cxa_allocate_exception(0x60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"cannot open for reading",&local_261);
  ImportError::ImportError(this_00,path,(string *)local_260,0,0);
  __cxa_throw(this_00,&ImportError::typeinfo,ImportError::~ImportError);
}

Assistant:

void Importer::load
    ( std::string const& path
    , utilmm::config_set const& config
    , Registry& registry)
{
    // Check that the input file can be opened
    ifstream s(path.c_str());
    if (!s)
        throw ImportError(path, "cannot open for reading");
    load(s, config, registry);
}